

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent::IfcTextLiteralWithExtent
          (IfcTextLiteralWithExtent *this)

{
  *(undefined ***)&this->field_0xb8 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(char **)&this->field_0xc8 = "IfcTextLiteralWithExtent";
  IfcTextLiteral::IfcTextLiteral(&this->super_IfcTextLiteral,&PTR_construction_vtable_24__0076bd50);
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x88 = 0;
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x90 = 0;
  (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x76bc98;
  *(undefined8 *)&this->field_0xb8 = 0x76bd38;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x76bcc0;
  *(undefined8 *)
   &(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x76bce8;
  *(undefined8 *)&(this->super_IfcTextLiteral).field_0x80 = 0x76bd10;
  (this->BoxAlignment)._M_dataplus._M_p = (pointer)&(this->BoxAlignment).field_2;
  (this->BoxAlignment)._M_string_length = 0;
  (this->BoxAlignment).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcTextLiteralWithExtent() : Object("IfcTextLiteralWithExtent") {}